

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Lookup
          (PersistentStorageJson *this,Registrar *aValue,
          vector<ot::commissioner::persistent_storage::Registrar,_std::allocator<ot::commissioner::persistent_storage::Registrar>_>
          *aRet)

{
  _Invoker_type aRet_00;
  Status SVar1;
  string local_e0;
  function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)> local_c0;
  Registrar local_90;
  anon_class_1_0_00000001 local_41;
  undefined1 local_40 [8];
  function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)> pred;
  vector<ot::commissioner::persistent_storage::Registrar,_std::allocator<ot::commissioner::persistent_storage::Registrar>_>
  *aRet_local;
  Registrar *aValue_local;
  PersistentStorageJson *this_local;
  
  pred._M_invoker = (_Invoker_type)aRet;
  std::function<bool(ot::commissioner::persistent_storage::Registrar_const&)>::
  function<ot::commissioner::persistent_storage::PersistentStorageJson::Lookup(ot::commissioner::persistent_storage::Registrar_const&,std::vector<ot::commissioner::persistent_storage::Registrar,std::allocator<ot::commissioner::persistent_storage::Registrar>>&)::__0,void>
            ((function<bool(ot::commissioner::persistent_storage::Registrar_const&)> *)local_40,
             &local_41);
  Registrar::Registrar(&local_90,aValue);
  std::function<bool(ot::commissioner::persistent_storage::Registrar_const&)>::operator=
            ((function<bool(ot::commissioner::persistent_storage::Registrar_const&)> *)local_40,
             (anon_class_72_1_4b93a6ce *)&local_90);
  Lookup(ot::commissioner::persistent_storage::Registrar_const&,std::vector<ot::commissioner::persistent_storage::Registrar,std::allocator<ot::commissioner::persistent_storage::Registrar>>&)
  ::$_1::~__1((__1 *)&local_90);
  std::function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)>::function
            (&local_c0,
             (function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)> *)local_40);
  aRet_00 = pred._M_invoker;
  std::__cxx11::string::string((string *)&local_e0,(string *)JSON_RGR_abi_cxx11_);
  SVar1 = LookupPred<ot::commissioner::persistent_storage::Registrar>
                    (this,&local_c0,
                     (vector<ot::commissioner::persistent_storage::Registrar,_std::allocator<ot::commissioner::persistent_storage::Registrar>_>
                      *)aRet_00,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)>::~function
            (&local_c0);
  std::function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)>::~function
            ((function<bool_(const_ot::commissioner::persistent_storage::Registrar_&)> *)local_40);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Lookup(Registrar const &aValue, std::vector<Registrar> &aRet)
{
    std::function<bool(Registrar const &)> pred = [](Registrar const &) { return true; };

    pred = [aValue](Registrar const &el) {
        bool aRet = (aValue.mId.mId == EMPTY_ID || (el.mId.mId == aValue.mId.mId)) &&
                    (aValue.mAddr.empty() || CaseInsensitiveEqual(aValue.mAddr, el.mAddr)) &&
                    (aValue.mPort == 0 || (aValue.mPort == el.mPort));

        if (aRet && !aValue.mDomains.empty())
        {
            std::vector<std::string> el_tmp(el.mDomains);
            std::vector<std::string> aValue_tmp(aValue.mDomains);
            std::sort(std::begin(el_tmp), std::end(el_tmp));
            std::sort(std::begin(aValue_tmp), std::end(aValue_tmp));
            aRet = std::includes(std::begin(el_tmp), std::end(el_tmp), std::begin(aValue_tmp), std::end(aValue_tmp));
        }
        return aRet;
    };

    return LookupPred<Registrar>(pred, aRet, JSON_RGR);
}